

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

index_t __thiscall GEO::Delaunay3d::stellate_cavity(Delaunay3d *this,index_t v)

{
  index_t iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  index_t iVar5;
  pointer piVar6;
  ulong uVar7;
  signed_index_t t2;
  ulong uVar8;
  long lVar9;
  index_t neigh3;
  index_t neigh2;
  index_t neigh1;
  index_t local_44;
  index_t local_40;
  index_t local_3c;
  undefined8 local_38;
  
  if ((this->cavity_).nb_f_ == 0) {
    iVar5 = 0xffffffff;
  }
  else {
    piVar6 = (this->cell_to_cell_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
             .super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0xa7f;
    uVar8 = 0;
    do {
      iVar1 = (this->cavity_).tglobal_[uVar8];
      iVar2 = piVar6[iVar1 * 4 + (this->cavity_).boundary_f_[uVar8]];
      iVar3 = *(int *)((long)&(this->super_Delaunay).super_Counted._vptr_Counted + lVar9 * 4);
      local_38 = *(undefined8 *)((long)this + lVar9 * 4 + -8);
      iVar5 = new_tetrahedron(this);
      uVar7 = (ulong)(iVar5 * 4);
      piVar6 = (this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
               super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6[uVar7] = v;
      *(undefined8 *)(piVar6 + uVar7 + 1) = local_38;
      piVar6[uVar7 + 3] = iVar3;
      piVar6 = (this->cell_to_cell_store_).
               super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
               super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6[uVar7] = iVar2;
      uVar7 = (ulong)(uint)(iVar2 * 4);
      piVar6[((uint)(piVar6[uVar7 + 1] == iVar1) + (uint)(piVar6[uVar7 + 2] == iVar1) * 2 |
             (uint)(piVar6[uVar7 + 3] == iVar1) * 3) + iVar2 * 4] = iVar5;
      (this->cavity_).tglobal_[uVar8] = iVar5;
      uVar8 = uVar8 + 1;
      uVar4 = (this->cavity_).nb_f_;
      lVar9 = lVar9 + 3;
    } while (uVar8 < uVar4);
    if (uVar4 != 0) {
      uVar8 = 0;
      do {
        iVar5 = (this->cavity_).tglobal_[uVar8];
        Cavity::get_facet_neighbor_tets(&this->cavity_,(index_t)uVar8,&local_3c,&local_40,&local_44)
        ;
        uVar7 = (ulong)(iVar5 * 4);
        piVar6 = (this->cell_to_cell_store_).
                 super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                 super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6[uVar7 + 1] = local_3c;
        piVar6[uVar7 + 2] = local_40;
        piVar6[uVar7 + 3] = local_44;
        uVar8 = uVar8 + 1;
      } while (uVar8 < (this->cavity_).nb_f_);
    }
  }
  return iVar5;
}

Assistant:

index_t Delaunay3d::stellate_cavity(index_t v) {
	
	index_t new_tet = index_t(-1);
	
	for(index_t f=0; f<cavity_.nb_facets(); ++f) {
	    index_t old_tet = cavity_.facet_tet(f);
	    index_t lf = cavity_.facet_facet(f);
	    index_t t_neigh = index_t(tet_adjacent(old_tet, lf));
	    signed_index_t v1 = cavity_.facet_vertex(f,0);
	    signed_index_t v2 = cavity_.facet_vertex(f,1);
	    signed_index_t v3 = cavity_.facet_vertex(f,2);
	    new_tet = new_tetrahedron(signed_index_t(v), v1, v2, v3);
	    set_tet_adjacent(new_tet, 0, t_neigh);
	    set_tet_adjacent(t_neigh, find_tet_adjacent(t_neigh,old_tet), new_tet);
	    cavity_.set_facet_tet(f, new_tet);
	}
	
	for(index_t f=0; f<cavity_.nb_facets(); ++f) {
	    new_tet = cavity_.facet_tet(f);
	    index_t neigh1, neigh2, neigh3;
	    cavity_.get_facet_neighbor_tets(f, neigh1, neigh2, neigh3);
	    set_tet_adjacent(new_tet, 1, neigh1);
	    set_tet_adjacent(new_tet, 2, neigh2);
	    set_tet_adjacent(new_tet, 3, neigh3);		
	}

	return new_tet;
    }